

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

int __thiscall
CEditor::DoButton_File
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  int iVar1;
  char *pText_00;
  long in_FS_OFFSET;
  uint uVar2;
  CUIRect Label;
  vec4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Checked == 0) {
    if ((this->m_UI).m_pHotItem != pID) goto LAB_00193251;
    local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3ea8f5c3;
  }
  else {
    uVar2 = 0x3f000000;
    if (Checked < 0) {
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
    }
    else {
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
      if ((this->m_UI).m_pHotItem == pID) {
        uVar2 = 0x3f400000;
      }
    }
    local_48.field_1.y = 0.0;
    local_48._8_8_ = (ulong)uVar2 << 0x20;
  }
  CUIRect::Draw(pRect,&local_48,3.0,0xf);
LAB_00193251:
  local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)pRect->x;
  local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)pRect->y;
  local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)pRect->w;
  local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)pRect->h;
  CUIRect::VMargin((CUIRect *)&local_48,5.0,(CUIRect *)&local_48);
  iVar1 = 4;
  CUI::DoLabel(&this->m_UI,(CUIRect *)&local_48,pText,10.0,4,-1.0,true);
  iVar1 = DoButton_Editor_Common(this,pID,pText_00,iVar1,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_File(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	if(Checked)
		pRect->Draw(GetButtonColor(pID, Checked), 3.0f);
	else if(UI()->HotItem() == pID)
		pRect->Draw(vec4(1,1,1,0.33f), 3.0f);

	CUIRect Label = *pRect;
	Label.VMargin(5.0f, &Label);
	UI()->DoLabel(&Label, pText, 10.0f, TEXTALIGN_ML);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}